

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_ConvertSignatureFromDer_Test::TestBody
          (ConfidentialTransactionContext_ConvertSignatureFromDer_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ByteData sigm;
  ByteData sig1;
  SigHashType sighashtype;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  int *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  AssertHelper local_138;
  Message local_130;
  int *local_128;
  undefined4 local_11c;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  size_t local_f8;
  undefined4 local_ec;
  AssertionResult local_e8;
  allocator local_d1;
  string local_d0;
  ByteData local_b0;
  ByteData local_98;
  allocator local_69;
  string local_68;
  ByteData local_48;
  ByteData local_30;
  SigHashType local_14;
  
  cfd::core::SigHashType::SigHashType(&local_14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,
             "304402204f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d416022045f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd01"
             ,&local_69);
  cfd::core::ByteData::ByteData(&local_48,&local_68);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_30,&local_48,&local_14);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b42c);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,
             "3043022020ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c021f105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc5501"
             ,&local_d1);
  cfd::core::ByteData::ByteData(&local_b0,&local_d0);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_98,&local_b0,&local_14);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b4b6);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_ec = 0x40;
  local_f8 = cfd::core::ByteData::GetDataSize(&local_30);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_100);
    in_stack_fffffffffffffea0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x22b671);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3a3,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message((Message *)0x22b6bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22b70e);
  local_11c = 0x40;
  local_128 = (int *)cfd::core::ByteData::GetDataSize(&local_98);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(uVar1,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0,local_128,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x22b7b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3a4,message);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x22b804);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22b850);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b85d);
  cfd::core::ByteData::~ByteData((ByteData *)0x22b86a);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, ConvertSignatureFromDer)
{
  SigHashType sighashtype;
  // 4f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d41645f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd
  ByteData sig1 = CryptoUtil::ConvertSignatureFromDer(
      ByteData("304402204f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d416022045f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd01"), &sighashtype);
  // 20ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c00105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc55
  ByteData sigm = CryptoUtil::ConvertSignatureFromDer(
      ByteData("3043022020ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c021f105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc5501"), &sighashtype);
  EXPECT_EQ(64, sig1.GetDataSize());
  EXPECT_EQ(64, sigm.GetDataSize());
}